

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
optional_caster<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::load(optional_caster<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,handle src,bool convert)

{
  bool bVar1;
  template_cast_op_type<typename_std::add_rvalue_reference<basic_string<char>_&&>::type> __args;
  undefined1 local_48 [8];
  value_conv inner_caster;
  bool convert_local;
  optional_caster<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  handle src_local;
  
  inner_caster.
  super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  .value.field_2._M_local_buf[0xf] = convert;
  this_local = (optional_caster<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)src.m_ptr;
  bVar1 = pybind11::handle::operator_cast_to_bool((handle *)&this_local);
  if (bVar1) {
    bVar1 = object_api<pybind11::handle>::is_none((object_api<pybind11::handle> *)&this_local);
    if (bVar1) {
      src_local.m_ptr._7_1_ = 1;
    }
    else {
      type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
      ::type_caster((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                     *)local_48);
      src_local.m_ptr._7_1_ =
           string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   *)local_48,(handle)this_local,
                  (bool)(inner_caster.
                         super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                         .value.field_2._M_local_buf[0xf] & 1));
      if ((bool)src_local.m_ptr._7_1_) {
        __args = cast_op<std::__cxx11::string&&>
                           ((make_caster<std::__cxx11::basic_string<char>_&&> *)local_48);
        std::optional<std::__cxx11::string>::emplace<std::__cxx11::string>
                  ((optional<std::__cxx11::string> *)this,__args);
      }
      type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
      ::~type_caster((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                      *)local_48);
    }
  }
  else {
    src_local.m_ptr._7_1_ = 0;
  }
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!src) {
            return false;
        }
        if (src.is_none()) {
            return true;  // default-constructed value is already empty
        }
        value_conv inner_caster;
        if (!inner_caster.load(src, convert))
            return false;

        value.emplace(cast_op<typename T::value_type &&>(std::move(inner_caster)));
        return true;
    }